

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int pkcs7_wrap(scep *s)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  OPENSSL_sk_compfunc p_Var5;
  stack_st_X509 *sk;
  OPENSSL_STACK *pOVar6;
  X509 *pXVar7;
  PKCS7 *pPVar8;
  BIO_METHOD *pBVar9;
  ulong uVar10;
  PKCS7_SIGNER_INFO *p7si;
  stack_st_X509_ATTRIBUTE *attrs;
  ASN1_OBJECT *data;
  X509_REQ *reqcsr;
  EVP_PKEY *signerkey;
  X509 *signercert;
  stack_st_X509_ATTRIBUTE *attributes;
  PKCS7_SIGNER_INFO *si;
  PKCS7 *p7enc;
  stack_st_X509 *recipients;
  int i;
  int len;
  int rc;
  uchar *buffer;
  BIO *base64bio;
  BIO *outbio;
  BIO *memorybio;
  BIO *pkcs7bio;
  BIO *encbio;
  BIO *databio;
  scep *s_local;
  
  encbio = (BIO *)0x0;
  pkcs7bio = (BIO *)0x0;
  memorybio = (BIO *)0x0;
  outbio = (BIO *)0x0;
  base64bio = (BIO *)0x0;
  buffer = (uchar *)0x0;
  _len = (void *)0x0;
  recipients._4_4_ = 0;
  signerkey = (EVP_PKEY *)0x0;
  reqcsr = (X509_REQ *)0x0;
  s->sender_nonce_len = 0x10;
  databio = (BIO *)s;
  pvVar3 = malloc((long)s->sender_nonce_len);
  *(void **)(databio + 0x48) = pvVar3;
  RAND_bytes(*(uchar **)(databio + 0x48),*(int *)(databio + 0x50));
  uVar1 = *(int *)databio - 0x13;
  if (uVar1 < 3 || *(int *)databio == 0x16) {
    switch((long)&switchD_0010b9a3::switchdataD_00111804 +
           (long)(int)(&switchD_0010b9a3::switchdataD_00111804)[uVar1]) {
    case 0x10b9a5:
      *(char **)(databio + 8) = "19";
      signerkey = *(EVP_PKEY **)(databio + 0x70);
      reqcsr = *(X509_REQ **)(databio + 0x78);
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x36,"creating inner PKCS#7");
      pBVar9 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar9);
      iVar2 = i2d_X509_REQ_bio((BIO *)encbio,(X509_REQ *)request);
      if (iVar2 < 1) {
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x3b,"error writing certificate request in bio");
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x3f,"inner PKCS#7 in mem BIO");
      break;
    case 0x10ba73:
      *(char **)(databio + 8) = "20";
      signerkey = *(EVP_PKEY **)(databio + 0x70);
      reqcsr = *(X509_REQ **)(databio + 0x78);
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x4d,"creating inner PKCS#7");
      pBVar9 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar9);
      iVar2 = i2d_PKCS7_ISSUER_AND_SUBJECT_bio
                        (encbio,*(PKCS7_ISSUER_AND_SUBJECT **)(databio + 0xa0));
      if (iVar2 < 1) {
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x52,"error writing GetCertInitial data in bio");
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      break;
    case 0x10bb23:
      *(char **)(databio + 8) = "21";
      signerkey = (EVP_PKEY *)localcert;
      reqcsr = (X509_REQ *)rsa;
      pBVar9 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar9);
      iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio(encbio,*(PKCS7_ISSUER_AND_SERIAL **)(databio + 0xa8));
      if (iVar2 < 1) {
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,99,"error writing GetCert data in bio");
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
      break;
    case 0x10bbb8:
      *(char **)(databio + 8) = "22";
      signerkey = (EVP_PKEY *)localcert;
      reqcsr = (X509_REQ *)rsa;
      pBVar9 = BIO_s_mem();
      encbio = (BIO *)BIO_new(pBVar9);
      iVar2 = i2d_PKCS7_ISSUER_AND_SERIAL_bio(encbio,*(PKCS7_ISSUER_AND_SERIAL **)(databio + 0xb0));
      if (iVar2 < 1) {
        log_log(4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x74,"error writing GetCert data in bio\n");
        ERR_print_errors_fp(_stderr);
        exit(0x61);
      }
    }
  }
  lVar4 = BIO_ctrl((BIO *)encbio,0xb,0,(void *)0x0);
  if ((int)lVar4 < 1) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x7d,"error flushing databio");
  }
  BIO_set_flags((BIO *)encbio,0x200);
  lVar4 = BIO_ctrl((BIO *)encbio,3,0,databio + 0x90);
  *(int *)(databio + 0x98) = (int)lVar4;
  if (v_flag != 0) {
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x86,"request data dump");
    PEM_write_X509_REQ(_stdout,(X509_REQ *)request);
  }
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0x8a,"data payload size: %d bytes",(ulong)*(uint *)(databio + 0x98));
  p_Var5 = ossl_check_X509_compfunc_type((sk_X509_compfunc)0x0);
  sk = (stack_st_X509 *)OPENSSL_sk_new(p_Var5);
  if (sk == (stack_st_X509 *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x8e,"error creating certificate stack");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  if (e_flag == 0) {
    pOVar6 = ossl_check_X509_sk_type(sk);
    pXVar7 = ossl_check_X509_type(cacert);
    iVar2 = OPENSSL_sk_push(pOVar6,pXVar7);
    if (iVar2 < 1) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x9d,"error adding recipient encryption certificate");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
  }
  else {
    pOVar6 = ossl_check_X509_sk_type(sk);
    pXVar7 = ossl_check_X509_type(encert);
    iVar2 = OPENSSL_sk_push(pOVar6,pXVar7);
    if (iVar2 < 1) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x96,"error adding recipient encryption certificate");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
  }
  if (d_flag != 0) {
    log_log(0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xa5,"hexdump request payload",0);
    for (recipients._4_4_ = 0; (int)recipients._4_4_ < *(int *)(databio + 0x98);
        recipients._4_4_ = recipients._4_4_ + 1) {
      fprintf(_stdout,"%02x ",
              (ulong)*(byte *)(*(long *)(databio + 0x90) + (long)(int)recipients._4_4_));
      if ((int)(recipients._4_4_ + 1) % 8 == 0) {
        fprintf(_stdout," ");
      }
      if ((int)(recipients._4_4_ + 1) % 0x10 == 0) {
        fprintf(_stdout,"\n");
      }
    }
    fprintf(_stdout,"\n");
  }
  log_log(0,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0xad,"hexdump payload %d",(ulong)recipients._4_4_);
  pkcs7bio = (BIO *)BIO_new_mem_buf(*(void **)(databio + 0x90),*(int *)(databio + 0x98));
  if ((BIO *)pkcs7bio == (BIO *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xb0,"error creating data bio");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  pPVar8 = PKCS7_encrypt((stack_st_X509 *)sk,(BIO *)pkcs7bio,(EVP_CIPHER *)enc_alg,0x80);
  if (pPVar8 == (PKCS7 *)0x0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xb7,"request payload encrypt failed");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0xbb,"successfully encrypted payload");
  pBVar9 = BIO_s_mem();
  outbio = (BIO *)BIO_new(pBVar9);
  iVar2 = i2d_PKCS7_bio((BIO *)outbio,pPVar8);
  if (iVar2 < 1) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xc0,"error writing encrypted data");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  BIO_ctrl((BIO *)outbio,0xb,0,(void *)0x0);
  BIO_set_flags((BIO *)outbio,0x200);
  uVar10 = BIO_ctrl((BIO *)outbio,3,0,&len);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,199,"envelope size: %d bytes",uVar10 & 0xffffffff);
  if (d_flag != 0) {
    log_log(0,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xc9,"printing PEM formatted PKCS#7");
    PEM_write_PKCS7(_stdout,pPVar8);
  }
  BIO_free((BIO *)outbio);
  log_log(1,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0xcf,"creating outer PKCS#7");
  pPVar8 = PKCS7_new();
  *(PKCS7 **)(databio + 0x88) = pPVar8;
  if (*(long *)(databio + 0x88) == 0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xd2,"failed creating PKCS#7 for signing");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  iVar2 = PKCS7_set_type(*(PKCS7 **)(databio + 0x88),0x16);
  if (iVar2 == 0) {
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xd7,"failed setting PKCS#7 type");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  PKCS7_add_certificate(*(PKCS7 **)(databio + 0x88),(X509 *)signerkey);
  p7si = PKCS7_add_signature(*(PKCS7 **)(databio + 0x88),(X509 *)signerkey,(EVP_PKEY *)reqcsr,
                             (EVP_MD *)sig_alg);
  if (p7si != (PKCS7_SIGNER_INFO *)0x0) {
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xe3,"signature added successfully");
    log_log(1,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0xe6,"adding signed attributes");
    attrs = (stack_st_X509_ATTRIBUTE *)OPENSSL_sk_new_null();
    add_attribute_string(attrs,nid_transId,*(char **)(databio + 0x40));
    add_attribute_string(attrs,nid_messageType,*(char **)(databio + 8));
    add_attribute_octet(attrs,nid_senderNonce,*(char **)(databio + 0x48),*(int *)(databio + 0x50));
    PKCS7_set_signed_attributes(p7si,(stack_st_X509_ATTRIBUTE *)attrs);
    data = OBJ_nid2obj(0x15);
    iVar2 = PKCS7_add_signed_attribute(p7si,0x32,6,data);
    if (iVar2 == 0) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0xef,"error adding NID_pkcs9_contentType");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    iVar2 = PKCS7_content_new(*(PKCS7 **)(databio + 0x88),0x15);
    if (iVar2 == 0) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0xf6,"failed setting PKCS#7 content type");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    memorybio = (BIO *)PKCS7_dataInit(*(PKCS7 **)(databio + 0x88),(BIO *)0x0);
    if ((BIO *)memorybio == (BIO *)0x0) {
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0xfe,"error opening bio for writing PKCS#7 data");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    iVar2 = BIO_write((BIO *)memorybio,_len,(int)uVar10);
    if ((int)uVar10 == iVar2) {
      log_log(1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x107,"PKCS#7 data written successfully");
      iVar2 = PKCS7_dataFinal(*(PKCS7 **)(databio + 0x88),(BIO *)memorybio);
      if (iVar2 != 0) {
        if (d_flag != 0) {
          log_log(0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                  ,0x110,"printing PEM fomatted PKCS#7");
          PEM_write_PKCS7(_stdout,*(PKCS7 **)(databio + 0x88));
        }
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x115,"applying base64 encoding");
        pBVar9 = BIO_s_mem();
        outbio = (BIO *)BIO_new(pBVar9);
        pBVar9 = BIO_f_base64();
        buffer = (uchar *)BIO_new(pBVar9);
        base64bio = (BIO *)BIO_push((BIO *)buffer,(BIO *)outbio);
        i2d_PKCS7_bio((BIO *)base64bio,*(PKCS7 **)(databio + 0x88));
        BIO_ctrl((BIO *)base64bio,0xb,0,(void *)0x0);
        BIO_set_flags((BIO *)outbio,0x200);
        lVar4 = BIO_ctrl((BIO *)outbio,3,0,databio + 0x90);
        *(int *)(databio + 0x98) = (int)lVar4;
        log_log(1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
                ,0x121,"base64 encoded payload size: %d bytes",(ulong)*(uint *)(databio + 0x98));
        BIO_free((BIO *)base64bio);
        BIO_free((BIO *)encbio);
        return 0;
      }
      log_log(4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
              ,0x10b,"error finalizing outer PKCS#7");
      ERR_print_errors_fp(_stderr);
      exit(0x61);
    }
    log_log(4,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
            ,0x103,"error writing PKCS#7 data");
    ERR_print_errors_fp(_stderr);
    exit(0x61);
  }
  log_log(4,"/workspace/llm4binary/github/license_all_cmakelists_25/Draegerwerk[P]sscep/src/pkcs7.c"
          ,0xdf,"error adding PKCS#7 signature");
  ERR_print_errors_fp(_stderr);
  exit(0x61);
}

Assistant:

int pkcs7_wrap(struct scep *s) {
    BIO                     *databio = NULL;
    BIO                     *encbio = NULL;
    BIO                     *pkcs7bio = NULL;
    BIO                     *memorybio = NULL;
    BIO                     *outbio = NULL;
    BIO                     *base64bio = NULL;
    unsigned char           *buffer = NULL;
    int                     rc, len = 0, i=0;
    STACK_OF(X509)          *recipients;
    PKCS7                   *p7enc;
    PKCS7_SIGNER_INFO       *si;
    X509_ATTRIBUTE_STACK    *attributes;
    X509                    *signercert = NULL;
    EVP_PKEY                *signerkey = NULL;
    X509_REQ                *reqcsr = NULL;

    // Create a new sender nonce for all messages XXXXXXXXXXXXXX should it be per transaction?
    s->sender_nonce_len = 16;
    s->sender_nonce = malloc(s->sender_nonce_len);
    RAND_bytes(s->sender_nonce, s->sender_nonce_len);

    // Prepare data payload
    switch(s->request_type) {
        case SCEP_REQUEST_PKCSREQ:
            // Set printable message type
            // We set this later as an autheticated attribute "messageType".
            s->request_type_str = SCEP_REQUEST_PKCSREQ_STR;

            // Signer cert
            signercert = s->signercert;
            signerkey = s->signerkey;

            // Create inner PKCS#7
            log_debug("creating inner PKCS#7");

            // Read request in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_X509_REQ_bio(databio, request)) <= 0) {
                log_error("error writing certificate request in bio");
                ERR_print_errors_fp(stderr);
                exit(SCEP_PKISTATUS_P7);
            } else {
                log_debug("inner PKCS#7 in mem BIO");
            }
            break;

        case SCEP_REQUEST_GETCERTINIT:

            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCERTINIT_STR;

            // Signer cert
            signercert = s->signercert;
            signerkey = s->signerkey;

            // Create inner PKCS#7
            log_debug("creating inner PKCS#7");

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SUBJECT_bio(databio, s->ias_getcertinit)) <= 0) {
                log_error("error writing GetCertInitial data in bio");
                ERR_print_errors_fp(stderr);
                exit (SCEP_PKISTATUS_P7);
            }
            break;

        case SCEP_REQUEST_GETCERT:
            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCERT_STR;

            // Signer cert
            signercert = localcert;
            signerkey = rsa;

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio, s->ias_getcert)) <= 0) {
                log_error("error writing GetCert data in bio");
                ERR_print_errors_fp(stderr);
                exit (SCEP_PKISTATUS_P7);
            }
            break;

        case SCEP_REQUEST_GETCRL:
            // Set printable message type
            s->request_type_str = SCEP_REQUEST_GETCRL_STR;

            // Signer cert
            signercert = localcert;
            signerkey = rsa;

            // Read data in memory bio
            databio = BIO_new(BIO_s_mem());
            if ((rc = i2d_PKCS7_ISSUER_AND_SERIAL_bio(databio, s->ias_getcrl)) <= 0) {
                log_error("error writing GetCert data in bio\n");
                ERR_print_errors_fp(stderr);
                exit(SCEP_PKISTATUS_P7);
            }

            break;
    }

    if( BIO_flush(databio) <= 0 ){
        log_error("error flushing databio");
    }
    BIO_set_flags(databio, BIO_FLAGS_MEM_RDONLY);

    // Below this is the common code for all request_type

    // Read in the payload
    s->request_len = BIO_get_mem_data(databio, &s->request_payload);
    if (v_flag){
        log_debug("request data dump");
        PEM_write_X509_REQ(stdout, request);
    }

    log_debug("data payload size: %d bytes", s->request_len);

    // Create encryption certificate stack
    if ((recipients = sk_X509_new(NULL)) == NULL) {
        log_error("error creating certificate stack");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Use different CA cert for encryption if requested
    if (e_flag) {
        if (sk_X509_push(recipients, encert) <= 0) {
            log_error("error adding recipient encryption certificate");
            ERR_print_errors_fp(stderr);
            exit (SCEP_PKISTATUS_P7);
        }
    } else {
        // Use same CA cert also for encryption
        if (sk_X509_push(recipients, cacert) <= 0) {
            log_error("error adding recipient encryption certificate");
            ERR_print_errors_fp(stderr);
            exit (SCEP_PKISTATUS_P7);
        }
    }

    // Create BIO for encryption
    if (d_flag){
        log_trace("hexdump request payload", i);
        for(i=0; i < s->request_len; i++ ) {
            fprintf(stdout, "%02x ", s->request_payload[i]);
            if ((i + 1) % 8 == 0) fprintf(stdout, " ");
            if ((i + 1) % 16 == 0) fprintf(stdout, "\n");
        }
        fprintf(stdout, "\n");
    }
    log_trace("hexdump payload %d", i);

    if ((encbio = BIO_new_mem_buf(s->request_payload, s->request_len)) == NULL) {
        log_error("error creating data bio");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }

    // Encrypt
    if (!(p7enc = PKCS7_encrypt(recipients, encbio, enc_alg, PKCS7_BINARY))) {
        log_error("request payload encrypt failed");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    log_debug("successfully encrypted payload");

    // Write encrypted data
    memorybio = BIO_new(BIO_s_mem());
    if (i2d_PKCS7_bio(memorybio, p7enc) <= 0) {
        log_error("error writing encrypted data");
        ERR_print_errors_fp(stderr);
        exit (SCEP_PKISTATUS_P7);
    }
    BIO_flush(memorybio);
    BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
    len = BIO_get_mem_data(memorybio, &buffer);
    log_debug("envelope size: %d bytes", len);
    if (d_flag) {
        log_trace("printing PEM formatted PKCS#7");
        PEM_write_PKCS7(stdout, p7enc);
    }
    BIO_free(memorybio);

    // Create outer PKCS#7
    log_debug("creating outer PKCS#7");
    s->request_p7 = PKCS7_new();
    if (s->request_p7 == NULL) {
        log_error("failed creating PKCS#7 for signing");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (!PKCS7_set_type(s->request_p7, NID_pkcs7_signed)) {
        log_error("failed setting PKCS#7 type");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Add signer certificate and signature
    PKCS7_add_certificate(s->request_p7, signercert);
    if ((si = PKCS7_add_signature(s->request_p7, signercert, signerkey, sig_alg)) == NULL) {
        log_error("error adding PKCS#7 signature");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    log_debug("signature added successfully");

    // Set signed attributes
    log_debug("adding signed attributes");
    attributes = sk_X509_ATTRIBUTE_new_null();
    add_attribute_string(attributes, nid_transId, s->transaction_id);
    add_attribute_string(attributes, nid_messageType, s->request_type_str);
    add_attribute_octet(attributes, nid_senderNonce, s->sender_nonce, s->sender_nonce_len);
    PKCS7_set_signed_attributes(si, attributes);

    // Add contentType
    if (!PKCS7_add_signed_attribute(si, NID_pkcs9_contentType, V_ASN1_OBJECT, OBJ_nid2obj(NID_pkcs7_data))) {
        log_error("error adding NID_pkcs9_contentType");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Create new content
    if (!PKCS7_content_new(s->request_p7, NID_pkcs7_data)) {
        log_error("failed setting PKCS#7 content type");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }

    // Write data
    pkcs7bio = PKCS7_dataInit(s->request_p7, NULL);
    if (pkcs7bio == NULL) {
        log_error("error opening bio for writing PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (len != BIO_write(pkcs7bio, buffer, len)) {
        log_error("error writing PKCS#7 data");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    log_debug("PKCS#7 data written successfully");

    // Finalize PKCS#7
    if (!PKCS7_dataFinal(s->request_p7, pkcs7bio)) {
        log_error("error finalizing outer PKCS#7");
        ERR_print_errors_fp(stderr);
        exit(SCEP_PKISTATUS_P7);
    }
    if (d_flag) {
        log_trace("printing PEM fomatted PKCS#7");
        PEM_write_PKCS7(stdout, s->request_p7);
    }

    // base64-encode the data
    log_debug("applying base64 encoding");

    // Create base64 filtering bio
    memorybio = BIO_new(BIO_s_mem());
    base64bio = BIO_new(BIO_f_base64());
    outbio = BIO_push(base64bio, memorybio);

    // Copy PKCS#7
    i2d_PKCS7_bio(outbio, s->request_p7);
    BIO_flush(outbio);
    BIO_set_flags(memorybio, BIO_FLAGS_MEM_RDONLY);
    s->request_len = BIO_get_mem_data(memorybio, &s->request_payload);
    log_debug("base64 encoded payload size: %d bytes", s->request_len);
    BIO_free(outbio);
    BIO_free(databio);
    return (0);
}